

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* gmlc::networking::extractInterfaceAndPortString
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *address)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  size_type sVar3;
  
  if (address->_M_string_length == 0) {
LAB_003c4258:
    __n = 0xffffffffffffffff;
  }
  else {
    sVar3 = address->_M_string_length;
    do {
      __n = sVar3 - 1;
      if (sVar3 == 0) goto LAB_003c4258;
      lVar2 = sVar3 - 1;
      sVar3 = __n;
    } while ((address->_M_dataplus)._M_p[lVar2] != ':');
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,
             0,__n);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,
             __n + 1,0xffffffffffffffff);
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    paVar1->_M_allocated_capacity = local_58.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_58.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_58._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         local_58.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->first)._M_string_length = local_58._M_string_length;
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    paVar1->_M_allocated_capacity = local_38.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_38.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = local_38._M_dataplus._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         local_38.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->second)._M_string_length = local_38._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string>
    extractInterfaceAndPortString(const std::string& address)
{
    auto lastColon = address.find_last_of(':');
    return {address.substr(0, lastColon), address.substr(lastColon + 1)};
}